

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator
          (cmMakefileExecutableTargetGenerator *this,cmGeneratorTarget *target)

{
  cmGeneratorTarget *this_00;
  cmOSXBundleGenerator *pcVar1;
  cmOSXBundleGenerator *this_01;
  string local_140;
  undefined1 local_120 [64];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileExecutableTargetGenerator_00a434e0;
  (this->DeviceLinkObject)._M_dataplus._M_p = (pointer)&(this->DeviceLinkObject).field_2;
  (this->DeviceLinkObject)._M_string_length = 0;
  (this->DeviceLinkObject).field_2._M_local_buf[0] = '\0';
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnDepends;
  this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_140,&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetExecutableNames((Names *)local_120,this_00,&local_140);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmMakefileTargetGenerator).TargetNames,(string *)local_120);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmMakefileTargetGenerator).TargetNames.Output,
             (string *)(local_120 + 0x20));
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmMakefileTargetGenerator).TargetNames.Real,local_e0);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmMakefileTargetGenerator).TargetNames.ImportOutput,local_c0);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmMakefileTargetGenerator).TargetNames.ImportReal,local_a0);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmMakefileTargetGenerator).TargetNames.ImportLibrary,local_80);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmMakefileTargetGenerator).TargetNames.PDB,local_60);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmMakefileTargetGenerator).TargetNames.SharedObject,local_40);
  cmGeneratorTarget::Names::~Names((Names *)local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  this_01 = (cmOSXBundleGenerator *)operator_new(0x20);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_01,target);
  pcVar1 = (this->super_cmMakefileTargetGenerator).OSXBundleGenerator._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  (this->super_cmMakefileTargetGenerator).OSXBundleGenerator._M_t.
  super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
  super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl = this_01;
  if (pcVar1 != (cmOSXBundleGenerator *)0x0) {
    operator_delete(pcVar1,0x20);
    this_01 = (this->super_cmMakefileTargetGenerator).OSXBundleGenerator._M_t.
              super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
              .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  }
  this_01->MacContentFolders = &(this->super_cmMakefileTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnDepends;
  this->TargetNames =
    this->GeneratorTarget->GetExecutableNames(this->GetConfigName());

  this->OSXBundleGenerator = cm::make_unique<cmOSXBundleGenerator>(target);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}